

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshkdf.c
# Opt level: O0

int SSHKDF(EVP_MD *evp_md,uchar *key,size_t key_len,uchar *xcghash,size_t xcghash_len,
          uchar *session_id,size_t session_id_len,char type,uchar *okey,size_t okey_len)

{
  int iVar1;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  EVP_MD *in_RDI;
  size_t in_R8;
  void *in_R9;
  size_t in_stack_00000008;
  int ret;
  size_t cursize;
  void *in_stack_00000018;
  uint dsize;
  uchar digest [64];
  EVP_MD_CTX *md;
  int local_9c;
  ulong local_98;
  uint local_8c;
  uchar local_88 [72];
  EVP_MD_CTX *local_40;
  void *local_38;
  size_t local_30;
  void *local_28;
  size_t local_20;
  void *local_18;
  EVP_MD *local_10;
  int local_4;
  
  local_40 = (EVP_MD_CTX *)0x0;
  local_8c = 0;
  local_9c = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = EVP_MD_CTX_new();
  if (local_40 == (EVP_MD_CTX *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)local_40,local_10,(ENGINE *)0x0);
    if (((((iVar1 != 0) &&
          (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,local_18,local_20), iVar1 != 0)) &&
         (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,local_28,local_30), iVar1 != 0)) &&
        ((iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,&cursize,1), iVar1 != 0 &&
         (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,local_38,in_stack_00000008), iVar1 != 0)))
        ) && (iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_40,local_88,&local_8c), iVar1 != 0)) {
      if ((ulong)digest._0_8_ < (ulong)local_8c) {
        memcpy(in_stack_00000018,local_88,digest._0_8_);
        local_9c = 1;
      }
      else {
        memcpy(in_stack_00000018,local_88,(ulong)local_8c);
        for (local_98 = (ulong)local_8c; local_98 < (ulong)digest._0_8_;
            local_98 = local_8c + local_98) {
          iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)local_40,local_10,(ENGINE *)0x0);
          if (((iVar1 == 0) ||
              (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,local_18,local_20), iVar1 == 0)) ||
             ((iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,local_28,local_30), iVar1 == 0 ||
              ((iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_40,in_stack_00000018,local_98),
               iVar1 == 0 ||
               (iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_40,local_88,&local_8c), iVar1 == 0)))
              ))) goto LAB_0032bd65;
          if ((ulong)digest._0_8_ < local_98 + local_8c) {
            memcpy((void *)((long)in_stack_00000018 + local_98),local_88,digest._0_8_ - local_98);
            local_9c = 1;
            goto LAB_0032bd65;
          }
          memcpy((void *)((long)in_stack_00000018 + local_98),local_88,(ulong)local_8c);
        }
        local_9c = 1;
      }
    }
LAB_0032bd65:
    EVP_MD_CTX_free((EVP_MD_CTX *)0x32bd6f);
    OPENSSL_cleanse(local_88,0x40);
    local_4 = local_9c;
  }
  return local_4;
}

Assistant:

static int SSHKDF(const EVP_MD *evp_md,
                  const unsigned char *key, size_t key_len,
                  const unsigned char *xcghash, size_t xcghash_len,
                  const unsigned char *session_id, size_t session_id_len,
                  char type, unsigned char *okey, size_t okey_len)
{
    EVP_MD_CTX *md = NULL;
    unsigned char digest[EVP_MAX_MD_SIZE];
    unsigned int dsize = 0;
    size_t cursize = 0;
    int ret = 0;

    md = EVP_MD_CTX_new();
    if (md == NULL)
        return 0;

    if (!EVP_DigestInit_ex(md, evp_md, NULL))
        goto out;

    if (!EVP_DigestUpdate(md, key, key_len))
        goto out;

    if (!EVP_DigestUpdate(md, xcghash, xcghash_len))
        goto out;

    if (!EVP_DigestUpdate(md, &type, 1))
        goto out;

    if (!EVP_DigestUpdate(md, session_id, session_id_len))
        goto out;

    if (!EVP_DigestFinal_ex(md, digest, &dsize))
        goto out;

    if (okey_len < dsize) {
        memcpy(okey, digest, okey_len);
        ret = 1;
        goto out;
    }

    memcpy(okey, digest, dsize);

    for (cursize = dsize; cursize < okey_len; cursize += dsize) {

        if (!EVP_DigestInit_ex(md, evp_md, NULL))
            goto out;

        if (!EVP_DigestUpdate(md, key, key_len))
            goto out;

        if (!EVP_DigestUpdate(md, xcghash, xcghash_len))
            goto out;

        if (!EVP_DigestUpdate(md, okey, cursize))
            goto out;

        if (!EVP_DigestFinal_ex(md, digest, &dsize))
            goto out;

        if (okey_len < cursize + dsize) {
            memcpy(okey + cursize, digest, okey_len - cursize);
            ret = 1;
            goto out;
        }

        memcpy(okey + cursize, digest, dsize);
    }

    ret = 1;

out:
    EVP_MD_CTX_free(md);
    OPENSSL_cleanse(digest, EVP_MAX_MD_SIZE);
    return ret;
}